

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O2

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>_>::Restore
          (TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>_> *this)

{
  TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism> *this_00;
  
  this_00 = (TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism> *)operator_new(0x2b0);
  TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>::TPZGeoElement(this_00);
  return (TPZSavable *)
         ((long)(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoPrism>).fGeo.
                super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
         *(long *)(*(long *)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoPrism>).super_TPZGeoEl +
                  -0x60) + -0x48);
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }